

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# charconv_parse.cc
# Opt level: O2

ParsedFloat *
absl::lts_20240722::strings_internal::ParseFloat<16>
          (ParsedFloat *__return_storage_ptr__,char *begin,char *end,chars_format format_flags)

{
  int *piVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  chars_format cVar5;
  long lVar6;
  long lVar8;
  int iVar9;
  bool *dropped_nonzero_digit;
  char *pcVar10;
  ulong uVar11;
  byte *begin_00;
  byte *pbVar12;
  char *pcVar13;
  char *pcVar14;
  bool mantissa_is_inexact;
  chars_format local_44;
  uint64_t mantissa;
  ulong local_38;
  byte *pbVar7;
  
  __return_storage_ptr__->mantissa = 0;
  __return_storage_ptr__->exponent = 0;
  __return_storage_ptr__->literal_exponent = 0;
  __return_storage_ptr__->type = kNumber;
  __return_storage_ptr__->subrange_begin = (char *)0x0;
  __return_storage_ptr__->subrange_end = (char *)0x0;
  __return_storage_ptr__->end = (char *)0x0;
  if (begin == end) {
    return __return_storage_ptr__;
  }
  bVar2 = anon_unknown_0::ParseInfinityOrNan(begin,end,__return_storage_ptr__);
  if (bVar2) {
    return __return_storage_ptr__;
  }
  pcVar10 = begin + 1;
  for (lVar8 = 0; (pcVar13 = begin + lVar8, pcVar13 < end && (*pcVar13 == '0')); lVar8 = lVar8 + 1)
  {
    pcVar10 = pcVar10 + 1;
  }
  mantissa = 0;
  mantissa_is_inexact = false;
  local_44 = format_flags;
  iVar3 = lts_20240722::(anonymous_namespace)::ConsumeDigits<16,unsigned_long>
                    (pcVar13,end,0xf,&mantissa,&mantissa_is_inexact);
  if (12499999 < iVar3) {
    return __return_storage_ptr__;
  }
  lVar6 = (long)iVar3;
  pbVar12 = (byte *)(pcVar13 + lVar6);
  dropped_nonzero_digit = (bool *)0xf;
  iVar4 = 0xf - iVar3;
  if (0xf < iVar3) {
    iVar4 = 0;
  }
  local_38 = (ulong)(iVar3 - 0xf);
  if (iVar3 < 0x10) {
    local_38 = 0;
  }
  if ((pbVar12 < end) && (*pbVar12 == 0x2e)) {
    pcVar13 = begin + lVar8 + lVar6 + 1;
    uVar11 = local_38;
    if (mantissa == 0) {
      pcVar10 = pcVar10 + lVar6;
      for (; (pcVar14 = end, pcVar13 < end && (pcVar14 = pcVar13, *pcVar13 == '0'));
          pcVar13 = pcVar13 + 1) {
        pcVar10 = pcVar10 + 1;
      }
      if (end < pcVar10) {
        pcVar10 = end;
      }
      iVar9 = 0xf;
      if (0xf < iVar3) {
        iVar9 = iVar3;
      }
      if (12499999 < (int)((~(uint)begin + ((int)pcVar10 - iVar3)) - (int)lVar8)) {
        return __return_storage_ptr__;
      }
      uVar11 = (ulong)((uint)begin - 0xe) + lVar8 + (ulong)(uint)((iVar3 + iVar9) - (int)pcVar10);
      pcVar13 = pcVar14;
    }
    dropped_nonzero_digit = &mantissa_is_inexact;
    iVar3 = lts_20240722::(anonymous_namespace)::ConsumeDigits<16,unsigned_long>
                      (pcVar13,end,iVar4,&mantissa,dropped_nonzero_digit);
    if (iVar3 < iVar4) {
      iVar4 = iVar3;
    }
    if (12499999 < iVar3) {
      return __return_storage_ptr__;
    }
    pbVar12 = (byte *)(pcVar13 + iVar3);
    local_38 = (ulong)(uint)((int)uVar11 - iVar4);
  }
  if (pbVar12 == (byte *)begin) {
    return __return_storage_ptr__;
  }
  if (((long)pbVar12 - (long)begin == 1) && (*begin == '.')) {
    return __return_storage_ptr__;
  }
  if (mantissa_is_inexact == true) {
    mantissa = mantissa | 1;
  }
  __return_storage_ptr__->mantissa = mantissa;
  __return_storage_ptr__->literal_exponent = 0;
  cVar5 = local_44 & general;
  pbVar7 = (byte *)(ulong)cVar5;
  if (((cVar5 != fixed) && (pbVar12 < end)) && ((*pbVar12 & 0xdf) == 0x50)) {
    piVar1 = &__return_storage_ptr__->literal_exponent;
    begin_00 = pbVar12 + 1;
    bVar2 = true;
    if (begin_00 < end) {
      if (*begin_00 == 0x2d) {
        bVar2 = false;
        begin_00 = pbVar12 + 2;
      }
      else {
        pbVar7 = pbVar12 + 2;
        if (*begin_00 == 0x2b) {
          begin_00 = pbVar7;
        }
      }
    }
    iVar4 = lts_20240722::(anonymous_namespace)::ConsumeDigits<10,int>
                      ((char *)begin_00,end,(int)piVar1,(int *)pbVar7,dropped_nonzero_digit);
    iVar3 = (int)local_38;
    pbVar7 = begin_00 + iVar4;
    if ((!bVar2) && (iVar4 != 0)) {
      *piVar1 = -*piVar1;
      goto LAB_0010cf0b;
    }
    if (iVar4 != 0) goto LAB_0010cf0b;
  }
  iVar3 = (int)local_38;
  pbVar7 = pbVar12;
  if (cVar5 == scientific) {
    return __return_storage_ptr__;
  }
LAB_0010cf0b:
  __return_storage_ptr__->type = kNumber;
  iVar4 = 0;
  if (__return_storage_ptr__->mantissa != 0) {
    iVar4 = iVar3 * 4 + __return_storage_ptr__->literal_exponent;
  }
  __return_storage_ptr__->exponent = iVar4;
  __return_storage_ptr__->end = (char *)pbVar7;
  return __return_storage_ptr__;
}

Assistant:

strings_internal::ParsedFloat ParseFloat(const char* begin, const char* end,
                                         chars_format format_flags) {
  strings_internal::ParsedFloat result;

  // Exit early if we're given an empty range.
  if (begin == end) return result;

  // Handle the infinity and NaN cases.
  if (ParseInfinityOrNan(begin, end, &result)) {
    return result;
  }

  const char* const mantissa_begin = begin;
  while (begin < end && *begin == '0') {
    ++begin;  // skip leading zeros
  }
  uint64_t mantissa = 0;

  int exponent_adjustment = 0;
  bool mantissa_is_inexact = false;
  int pre_decimal_digits = ConsumeDigits<base>(
      begin, end, MantissaDigitsMax<base>(), &mantissa, &mantissa_is_inexact);
  begin += pre_decimal_digits;
  int digits_left;
  if (pre_decimal_digits >= DigitLimit<base>()) {
    // refuse to parse pathological inputs
    return result;
  } else if (pre_decimal_digits > MantissaDigitsMax<base>()) {
    // We dropped some non-fraction digits on the floor.  Adjust our exponent
    // to compensate.
    exponent_adjustment =
        static_cast<int>(pre_decimal_digits - MantissaDigitsMax<base>());
    digits_left = 0;
  } else {
    digits_left =
        static_cast<int>(MantissaDigitsMax<base>() - pre_decimal_digits);
  }
  if (begin < end && *begin == '.') {
    ++begin;
    if (mantissa == 0) {
      // If we haven't seen any nonzero digits yet, keep skipping zeros.  We
      // have to adjust the exponent to reflect the changed place value.
      const char* begin_zeros = begin;
      while (begin < end && *begin == '0') {
        ++begin;
      }
      int zeros_skipped = static_cast<int>(begin - begin_zeros);
      if (zeros_skipped >= DigitLimit<base>()) {
        // refuse to parse pathological inputs
        return result;
      }
      exponent_adjustment -= static_cast<int>(zeros_skipped);
    }
    int post_decimal_digits = ConsumeDigits<base>(
        begin, end, digits_left, &mantissa, &mantissa_is_inexact);
    begin += post_decimal_digits;

    // Since `mantissa` is an integer, each significant digit we read after
    // the decimal point requires an adjustment to the exponent. "1.23e0" will
    // be stored as `mantissa` == 123 and `exponent` == -2 (that is,
    // "123e-2").
    if (post_decimal_digits >= DigitLimit<base>()) {
      // refuse to parse pathological inputs
      return result;
    } else if (post_decimal_digits > digits_left) {
      exponent_adjustment -= digits_left;
    } else {
      exponent_adjustment -= post_decimal_digits;
    }
  }
  // If we've found no mantissa whatsoever, this isn't a number.
  if (mantissa_begin == begin) {
    return result;
  }
  // A bare "." doesn't count as a mantissa either.
  if (begin - mantissa_begin == 1 && *mantissa_begin == '.') {
    return result;
  }

  if (mantissa_is_inexact) {
    // We dropped significant digits on the floor.  Handle this appropriately.
    if (base == 10) {
      // If we truncated significant decimal digits, store the full range of the
      // mantissa for future big integer math for exact rounding.
      result.subrange_begin = mantissa_begin;
      result.subrange_end = begin;
    } else if (base == 16) {
      // If we truncated hex digits, reflect this fact by setting the low
      // ("sticky") bit.  This allows for correct rounding in all cases.
      mantissa |= 1;
    }
  }
  result.mantissa = mantissa;

  const char* const exponent_begin = begin;
  result.literal_exponent = 0;
  bool found_exponent = false;
  if (AllowExponent(format_flags) && begin < end &&
      IsExponentCharacter<base>(*begin)) {
    bool negative_exponent = false;
    ++begin;
    if (begin < end && *begin == '-') {
      negative_exponent = true;
      ++begin;
    } else if (begin < end && *begin == '+') {
      ++begin;
    }
    const char* const exponent_digits_begin = begin;
    // Exponent is always expressed in decimal, even for hexadecimal floats.
    begin += ConsumeDigits<10>(begin, end, kDecimalExponentDigitsMax,
                               &result.literal_exponent, nullptr);
    if (begin == exponent_digits_begin) {
      // there were no digits where we expected an exponent.  We failed to read
      // an exponent and should not consume the 'e' after all.  Rewind 'begin'.
      found_exponent = false;
      begin = exponent_begin;
    } else {
      found_exponent = true;
      if (negative_exponent) {
        result.literal_exponent = -result.literal_exponent;
      }
    }
  }

  if (!found_exponent && RequireExponent(format_flags)) {
    // Provided flags required an exponent, but none was found.  This results
    // in a failure to scan.
    return result;
  }

  // Success!
  result.type = strings_internal::FloatType::kNumber;
  if (result.mantissa > 0) {
    result.exponent = result.literal_exponent +
                      (DigitMagnitude<base>() * exponent_adjustment);
  } else {
    result.exponent = 0;
  }
  result.end = begin;
  return result;
}